

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Node * __thiscall JSON::Parser::parseNode(Node *__return_storage_ptr__,Parser *this)

{
  string *this_00;
  TokenType TVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  _Alloc_hider _Var5;
  string tokenValue;
  undefined1 local_298 [40];
  undefined1 local_270 [40];
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  pointer local_218;
  int local_20c;
  string local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  string local_1c8;
  string local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  string local_168;
  string local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_48;
  
  (__return_storage_ptr__->type)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->type).field_2
  ;
  (__return_storage_ptr__->type)._M_string_length = 0;
  (__return_storage_ptr__->type).field_2._M_local_buf[0] = '\0';
  this_00 = &__return_storage_ptr__->rawValue;
  (__return_storage_ptr__->rawValue)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->rawValue).field_2;
  (__return_storage_ptr__->rawValue)._M_string_length = 0;
  (__return_storage_ptr__->rawValue).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar1 = (this->currentToken).type;
  local_20c = (this->currentToken).start;
  if ((int)TVar1 < 0x2f) {
    if (TVar1 == STRING) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,NodeType::StringLiteral_abi_cxx11_,
                 DAT_0010e390 + NodeType::StringLiteral_abi_cxx11_);
      pcVar2 = (this->currentToken).value._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + (this->currentToken).value._M_string_length);
      Node::Node((Node *)local_270,&local_68,&local_88,(this->currentToken).start,
                 (this->currentToken).end);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_270);
      __return_storage_ptr__->start = local_270._32_4_;
      __return_storage_ptr__->end = local_270._36_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_248);
      local_298._0_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_298._8_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_298._16_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_allocated_capacity;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_218;
      local_228._M_allocated_capacity = 0;
      local_228._8_8_ = (pointer)0x0;
      local_218 = (pointer)0x0;
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
                ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)local_298);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
                ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != &local_238) {
        operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
      }
      if ((pointer)local_270._0_8_ != (pointer)(local_270 + 0x10)) {
        operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      _Var5._M_p = local_68._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_001049be:
        operator_delete(_Var5._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (TVar1 != NUMBER) {
LAB_00104cef:
        unexpected(this,&this->currentToken);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,NodeType::NumericLiteral_abi_cxx11_,
                 DAT_0010e3b0 + NodeType::NumericLiteral_abi_cxx11_);
      pcVar2 = (this->currentToken).value._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar2,pcVar2 + (this->currentToken).value._M_string_length);
      Node::Node((Node *)local_270,&local_a8,&local_c8,(this->currentToken).start,
                 (this->currentToken).end);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_270);
      __return_storage_ptr__->start = local_270._32_4_;
      __return_storage_ptr__->end = local_270._36_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_248);
      local_298._0_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_298._8_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_298._16_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_allocated_capacity;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_218;
      local_228._M_allocated_capacity = 0;
      local_228._8_8_ = (pointer)0x0;
      local_218 = (pointer)0x0;
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
                ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)local_298);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
                ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != &local_238) {
        operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
      }
      if ((pointer)local_270._0_8_ != (pointer)(local_270 + 0x10)) {
        operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      local_68.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
      _Var5._M_p = local_a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) goto LAB_001049be;
    }
    next(this);
    goto LAB_00104cc9;
  }
  if (TVar1 == WORD) {
    local_298._0_8_ = local_298 + 0x10;
    pcVar2 = (this->currentToken).value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_298,pcVar2,pcVar2 + (this->currentToken).value._M_string_length);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_298._0_8_,
               (undefined1 *)
               ((long)&(((string *)local_298._0_8_)->_M_dataplus)._M_p +
               (long)&(((string *)local_298._8_8_)->_M_dataplus)._M_p));
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"null","");
    bVar3 = stringEquals(&local_1c8,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,NodeType::NullLiteral_abi_cxx11_,
                 DAT_0010e3f0 + NodeType::NullLiteral_abi_cxx11_);
      local_128._M_allocated_capacity = (size_type)&local_118;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_298._0_8_,
                 (undefined1 *)
                 ((long)&(((string *)local_298._0_8_)->_M_dataplus)._M_p +
                 (long)&(((string *)local_298._8_8_)->_M_dataplus)._M_p));
      Node::Node((Node *)local_270,&local_108,(string *)&local_128,(this->currentToken).start,
                 (this->currentToken).end);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_270);
      __return_storage_ptr__->start = local_270._32_4_;
      __return_storage_ptr__->end = local_270._36_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_248);
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_start =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_allocated_capacity;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_218;
      local_228._M_allocated_capacity = 0;
      local_228._8_8_ = (pointer)0x0;
      local_218 = (pointer)0x0;
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_48);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
                ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != &local_238) {
        operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
      }
      if ((pointer)local_270._0_8_ != (pointer)(local_270 + 0x10)) {
        operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_allocated_capacity != &local_118) {
        operator_delete((void *)local_128._M_allocated_capacity,local_118._M_allocated_capacity + 1)
        ;
      }
      local_148.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
      _Var5._M_p = local_108._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
LAB_00104c9e:
        operator_delete(_Var5._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_1e8._M_allocated_capacity = (size_type)&local_1d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_298._0_8_,
                 (undefined1 *)
                 ((long)&(((string *)local_298._0_8_)->_M_dataplus)._M_p +
                 (long)&(((string *)local_298._8_8_)->_M_dataplus)._M_p));
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"true","");
      bVar4 = stringEquals((string *)&local_1e8,&local_208);
      bVar3 = true;
      if (!bVar4) {
        local_188._M_allocated_capacity = (size_type)&local_178;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,local_298._0_8_,
                   (undefined1 *)
                   ((long)&(((string *)local_298._0_8_)->_M_dataplus)._M_p +
                   (long)&(((string *)local_298._8_8_)->_M_dataplus)._M_p));
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"false","");
        bVar3 = stringEquals((string *)&local_188,&local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_allocated_capacity != &local_178) {
          operator_delete((void *)local_188._M_allocated_capacity,
                          local_178._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_allocated_capacity != &local_1d8) {
        operator_delete((void *)local_1e8._M_allocated_capacity,local_1d8._M_allocated_capacity + 1)
        ;
      }
      if (bVar3 == false) {
        unexpected(this,&this->currentToken);
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,NodeType::BooleanLiteral_abi_cxx11_,
                 DAT_0010e3d0 + NodeType::BooleanLiteral_abi_cxx11_);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,local_298._0_8_,
                 (undefined1 *)
                 ((long)&(((string *)local_298._0_8_)->_M_dataplus)._M_p +
                 (long)&(((string *)local_298._8_8_)->_M_dataplus)._M_p));
      Node::Node((Node *)local_270,&local_148,&local_168,(this->currentToken).start,
                 (this->currentToken).end);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_270);
      __return_storage_ptr__->start = local_270._32_4_;
      __return_storage_ptr__->end = local_270._36_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_248);
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_start =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_allocated_capacity;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_218;
      local_228._M_allocated_capacity = 0;
      local_228._8_8_ = (pointer)0x0;
      local_218 = (pointer)0x0;
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_48);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
                ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != &local_238) {
        operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
      }
      if ((pointer)local_270._0_8_ != (pointer)(local_270 + 0x10)) {
        operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      _Var5._M_p = local_148._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_00104c9e;
    }
    next(this);
    local_270._16_8_ = local_298._16_8_;
    local_270._0_8_ = local_298._0_8_;
    if ((pointer)local_298._0_8_ == (pointer)(local_298 + 0x10)) goto LAB_00104cc9;
  }
  else {
    if (TVar1 == BRACKETS_START) {
      parseArrayExpression((Node *)local_270,this);
    }
    else {
      if (TVar1 != BRACES_START) goto LAB_00104cef;
      parseObjectExpression((Node *)local_270,this);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_270);
    __return_storage_ptr__->start = local_270._32_4_;
    __return_storage_ptr__->end = local_270._36_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_248);
    local_298._0_8_ =
         (__return_storage_ptr__->children).
         super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.super__Vector_impl_data
         ._M_start;
    local_298._8_8_ =
         (__return_storage_ptr__->children).
         super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    local_298._16_8_ =
         (__return_storage_ptr__->children).
         super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage;
    (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_allocated_capacity;
    (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
    (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_218;
    local_228._M_allocated_capacity = 0;
    local_228._8_8_ = (pointer)0x0;
    local_218 = (pointer)0x0;
    std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
              ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)local_298);
    std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
              ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_p != &local_238) {
      operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
    }
    if ((pointer)local_270._0_8_ == (pointer)(local_270 + 0x10)) goto LAB_00104cc9;
  }
  operator_delete((void *)local_270._0_8_,
                  (ulong)((long)&(((pointer)local_270._16_8_)->type)._M_dataplus._M_p + 1));
LAB_00104cc9:
  __return_storage_ptr__->start = local_20c;
  __return_storage_ptr__->end = (this->lastToken).end;
  return __return_storage_ptr__;
}

Assistant:

Node Parser::parseNode() {
        Node node;
        int startPos = currentToken.start;
        TokenType type = currentToken.type;

        if (type == BRACES_START) {
            node = parseObjectExpression();
        } else if (type == BRACKETS_START) {
            node = parseArrayExpression();
        } else if (type == STRING) {
            node = Node(NodeType::StringLiteral, currentToken.value, currentToken.start, currentToken.end);
            next();
        } else if (type == NUMBER) {
            node = Node(NodeType::NumericLiteral, currentToken.value, currentToken.start, currentToken.end);
            next();
        } else if (type == WORD) {
            string tokenValue = currentToken.value;
            if (stringEquals(tokenValue, "null")) {
                node = Node(NodeType::NullLiteral, tokenValue, currentToken.start, currentToken.end);
                next();
            } else if (stringEquals(tokenValue, "true") || stringEquals(tokenValue, "false")) {
                node = Node(NodeType::BooleanLiteral, tokenValue, currentToken.start, currentToken.end);
                next();
            } else {
                unexpected(currentToken);
            }
        } else {
            unexpected(currentToken);
        }

        node.start = startPos;
        node.end = lastToken.end;

        return node;
    }